

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O3

xcb_generic_iterator_t xcb_input_button_state_end(xcb_input_button_state_iterator_t i)

{
  xcb_generic_iterator_t xVar1;
  
  xVar1._8_8_ = i._8_8_ * 0x2400000001 & 0xffffffff00000000;
  xVar1.data = i.data + i.rem;
  return xVar1;
}

Assistant:

xcb_generic_iterator_t
xcb_input_button_state_end (xcb_input_button_state_iterator_t i)
{
    xcb_generic_iterator_t ret;
    ret.data = i.data + i.rem;
    ret.index = i.index + ((char *) ret.data - (char *) i.data);
    ret.rem = 0;
    return ret;
}